

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O2

void __thiscall CEditor::DoMapBorder(CEditor *this)

{
  int iVar1;
  int iVar2;
  CLayer *pCVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  int in_ESI;
  ulong uVar7;
  uint uVar8;
  
  pCVar3 = GetSelectedLayerType(this,in_ESI,2);
  iVar1 = *(int *)((long)&pCVar3[1].m_pEditor + 4);
  uVar6 = 0;
  uVar7 = (ulong)(uint)(iVar1 * 2);
  if (iVar1 * 2 < 1) {
    uVar7 = uVar6;
  }
  for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
    *(undefined1 *)(*(long *)(pCVar3[2].m_aName + 8) + uVar6 * 4) = 1;
  }
  iVar2 = *(int *)pCVar3[1].m_aName;
  uVar8 = iVar2 * iVar1;
  uVar7 = 0;
  uVar6 = 0;
  if (0 < (int)uVar8) {
    uVar6 = (ulong)uVar8;
  }
  for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
    uVar5 = (uint)((long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff) %
                  (long)iVar1);
    if (iVar1 + -3 < (int)uVar5 || uVar5 < 2) {
      *(undefined1 *)(*(long *)(pCVar3[2].m_aName + 8) + uVar7 * 4) = 1;
    }
  }
  for (lVar4 = (long)((iVar2 + -2) * iVar1); lVar4 < (int)uVar8; lVar4 = lVar4 + 1) {
    *(undefined1 *)(*(long *)(pCVar3[2].m_aName + 8) + lVar4 * 4) = 1;
  }
  return;
}

Assistant:

void CEditor::DoMapBorder()
{
	CLayerTiles *pT = (CLayerTiles *)GetSelectedLayerType(0, LAYERTYPE_TILES);

	for(int i = 0; i < pT->m_Width*2; ++i)
		pT->m_pTiles[i].m_Index = 1;

	for(int i = 0; i < pT->m_Width*pT->m_Height; ++i)
	{
		if(i%pT->m_Width < 2 || i%pT->m_Width > pT->m_Width-3)
			pT->m_pTiles[i].m_Index = 1;
	}

	for(int i = (pT->m_Width*(pT->m_Height-2)); i < pT->m_Width*pT->m_Height; ++i)
		pT->m_pTiles[i].m_Index = 1;
}